

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigNumber.cpp
# Opt level: O0

BigNumber * operator+(BigNumber *__return_storage_ptr__,BigNumber *nb1,uint nb2)

{
  initializer_list<unsigned_int> __l;
  BigNumber local_c0;
  BigNumber local_a0;
  allocator<unsigned_int> local_6d;
  uint local_6c;
  iterator local_68;
  size_type local_60;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_58;
  undefined1 local_40 [8];
  BigNumber tmp;
  uint nb2_local;
  BigNumber *nb1_local;
  
  local_68 = &local_6c;
  local_60 = 1;
  local_6c = nb2;
  tmp.m_base._4_4_ = nb2;
  std::allocator<unsigned_int>::allocator(&local_6d);
  __l._M_len = local_60;
  __l._M_array = local_68;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_58,__l,&local_6d);
  BigNumber::BigNumber((BigNumber *)local_40,&local_58,nb1->m_base);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_58);
  std::allocator<unsigned_int>::~allocator(&local_6d);
  BigNumber::BigNumber(&local_a0,nb1);
  BigNumber::BigNumber(&local_c0,(BigNumber *)local_40);
  operator+(__return_storage_ptr__,&local_a0,&local_c0);
  BigNumber::~BigNumber(&local_c0);
  BigNumber::~BigNumber(&local_a0);
  BigNumber::~BigNumber((BigNumber *)local_40);
  return __return_storage_ptr__;
}

Assistant:

BigNumber operator + (BigNumber nb1, unsigned int nb2) {
    BigNumber tmp({nb2}, nb1.m_base);
    return nb1 + tmp;
}